

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_struct_swap(t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  e_req eVar2;
  t_field *ptVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  pointer pptVar8;
  string local_58;
  pointer local_38;
  
  iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var,iVar6),"a");
  if (bVar4) {
LAB_001711c0:
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_58);
    poVar7 = std::operator<<(poVar7,"void swap(");
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_01,iVar6));
    poVar7 = std::operator<<(poVar7," &a1, ");
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_02,iVar6));
    poVar7 = std::operator<<(poVar7," &a2) {");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
  else {
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_00,iVar6),"b");
    if (bVar4) goto LAB_001711c0;
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_58);
    poVar7 = std::operator<<(poVar7,"void swap(");
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_03,iVar6));
    poVar7 = std::operator<<(poVar7," &a, ");
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_04,iVar6));
    poVar7 = std::operator<<(poVar7," &b) {");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_58);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
  poVar7 = std::operator<<(out,(string *)&local_58);
  poVar7 = std::operator<<(poVar7,"using ::std::swap;");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_58);
  local_38 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  bVar4 = false;
  for (pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; pptVar8 != local_38;
      pptVar8 = pptVar8 + 1) {
    ptVar3 = *pptVar8;
    eVar2 = ptVar3->req_;
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_05,iVar6),"a");
    if (bVar5) {
LAB_00171396:
      t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
      poVar7 = std::operator<<(out,(string *)&local_58);
      poVar7 = std::operator<<(poVar7,"swap(a1.");
      poVar7 = std::operator<<(poVar7,(string *)&ptVar3->name_);
      poVar7 = std::operator<<(poVar7,", a2.");
      poVar7 = std::operator<<(poVar7,(string *)&ptVar3->name_);
      poVar7 = std::operator<<(poVar7,");");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
    else {
      iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var_06,iVar6),"b");
      if (bVar5) goto LAB_00171396;
      t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
      poVar7 = std::operator<<(out,(string *)&local_58);
      poVar7 = std::operator<<(poVar7,"swap(a.");
      poVar7 = std::operator<<(poVar7,(string *)&ptVar3->name_);
      poVar7 = std::operator<<(poVar7,", b.");
      poVar7 = std::operator<<(poVar7,(string *)&ptVar3->name_);
      poVar7 = std::operator<<(poVar7,");");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&local_58);
    bVar4 = (bool)(bVar4 | eVar2 != T_REQUIRED);
  }
  if (bVar4) {
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_07,iVar6),"a");
    if (bVar4) {
LAB_001714cc:
      t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
      poVar7 = std::operator<<(out,(string *)&local_58);
      poVar7 = std::operator<<(poVar7,"swap(a1.__isset, a2.__isset);");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
    else {
      iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var_08,iVar6),"b");
      if (bVar4) goto LAB_001714cc;
      t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
      poVar7 = std::operator<<(out,(string *)&local_58);
      poVar7 = std::operator<<(poVar7,"swap(a.__isset, b.__isset);");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) goto LAB_001716b3;
  iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var_09,iVar6),"a");
  if (bVar4) {
LAB_001715a0:
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_58);
    poVar7 = std::operator<<(poVar7,"(void) a1;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_58);
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_58);
    poVar7 = std::operator<<(poVar7,"(void) a2;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
  else {
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_10,iVar6),"b");
    if (bVar4) goto LAB_001715a0;
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_58);
    poVar7 = std::operator<<(poVar7,"(void) a;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_58);
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_58);
    poVar7 = std::operator<<(poVar7,"(void) b;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_58);
LAB_001716b3:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_swap(ostream& out, t_struct* tstruct) {
  if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
    out << indent() << "void swap(" << tstruct->get_name() << " &a1, " << tstruct->get_name()
        << " &a2) {" << endl; 
  } else {
    out << indent() << "void swap(" << tstruct->get_name() << " &a, " << tstruct->get_name()
        << " &b) {" << endl;
  }

  indent_up();

  // Let argument-dependent name lookup find the correct swap() function to
  // use based on the argument types.  If none is found in the arguments'
  // namespaces, fall back to ::std::swap().
  out << indent() << "using ::std::swap;" << endl;

  bool has_nonrequired_fields = false;
  const vector<t_field*>& fields = tstruct->get_members();
  for (auto tfield : fields) {
    if (tfield->get_req() != t_field::T_REQUIRED) {
      has_nonrequired_fields = true;
    }

    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "swap(a1." << tfield->get_name() << ", a2." << tfield->get_name() << ");"
          << endl;
    } else {
      out << indent() << "swap(a." << tfield->get_name() << ", b." << tfield->get_name() << ");"
          << endl;
    }
  }

  if (has_nonrequired_fields) {
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "swap(a1.__isset, a2.__isset);" << endl; 
    } else {
      out << indent() << "swap(a.__isset, b.__isset);" << endl;
    }
  }

  // handle empty structs
  if (fields.size() == 0) {
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "(void) a1;" << endl;
      out << indent() << "(void) a2;" << endl;
    } else {
      out << indent() << "(void) a;" << endl;
      out << indent() << "(void) b;" << endl;
    }
  }

  scope_down(out);
  out << endl;
}